

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aig.h
# Opt level: O2

Aig_Obj_t * Aig_ObjChild1Copy(Aig_Obj_t *pObj)

{
  ulong uVar1;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                  ,0x139,"Aig_Obj_t *Aig_ObjChild1Copy(Aig_Obj_t *)");
  }
  uVar1 = (ulong)pObj->pFanin1 & 0xfffffffffffffffe;
  if (uVar1 != 0) {
    return (Aig_Obj_t *)((ulong)((uint)pObj->pFanin1 & 1) ^ *(ulong *)(uVar1 + 0x28));
  }
  return (Aig_Obj_t *)0x0;
}

Assistant:

static inline Aig_Obj_t *  Aig_ObjChild1Copy( Aig_Obj_t * pObj )  { assert( !Aig_IsComplement(pObj) ); return Aig_ObjFanin1(pObj)? Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin1(pObj)->pData, Aig_ObjFaninC1(pObj)) : NULL;  }